

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall
glslang::TParseContext::inheritMemoryQualifiers(TParseContext *this,TQualifier *from,TQualifier *to)

{
  if ((from->field_0xd & 0x80) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x800000000000;
  }
  if ((from->field_0xe & 1) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x1000000000000;
  }
  if ((from->field_0xe & 2) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x2000000000000;
  }
  if ((from->field_0xe & 4) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x4000000000000;
  }
  if ((from->field_0xe & 8) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x8000000000000;
  }
  if ((from->field_0xd & 0x40) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x400000000000;
  }
  return;
}

Assistant:

bool isWriteOnly() const { return writeonly; }